

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O2

Fxch_SCHashTable_t * Fxch_SCHashTableCreate(Fxch_Man_t *pFxchMan,int nEntries)

{
  Fxch_SCHashTable_t *pFVar1;
  Fxch_SCHashTable_Entry_t *pFVar2;
  uint uVar3;
  
  pFVar1 = (Fxch_SCHashTable_t *)calloc(1,0x38);
  uVar3 = nEntries + 1;
  if (1 < uVar3) {
    uVar3 = 0;
    for (; nEntries != 0; nEntries = (uint)nEntries >> 1) {
      uVar3 = uVar3 + 1;
    }
  }
  uVar3 = 1 << ((byte)uVar3 & 0x1f);
  pFVar1->pFxchMan = pFxchMan;
  pFVar1->SizeMask = uVar3 - 1;
  pFVar2 = (Fxch_SCHashTable_Entry_t *)calloc((ulong)uVar3,0x10);
  pFVar1->pBins = pFVar2;
  return pFVar1;
}

Assistant:

Fxch_SCHashTable_t* Fxch_SCHashTableCreate( Fxch_Man_t* pFxchMan,
                                            int nEntries )
{
    Fxch_SCHashTable_t* pSCHashTable = ABC_CALLOC( Fxch_SCHashTable_t, 1 );
    int nBits = Abc_Base2Log( nEntries + 1 );


    pSCHashTable->pFxchMan = pFxchMan;
    pSCHashTable->SizeMask = (1 << nBits) - 1;
    pSCHashTable->pBins = ABC_CALLOC( Fxch_SCHashTable_Entry_t, pSCHashTable->SizeMask + 1 );

    return pSCHashTable;
}